

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

void __thiscall chrono::viper::Viper::SetSuspensionVisualization(Viper *this,bool state)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *(bool *)(*(long *)((long)&(this->m_lower_arms)._M_elems[0].
                               super___shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar1) + 0x230) = state;
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *(bool *)(*(long *)((long)&(this->m_upper_arms)._M_elems[0].
                               super___shared_ptr<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar1) + 0x230) = state;
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *(bool *)(*(long *)((long)&(this->m_uprights)._M_elems[0].
                               super___shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar1) + 0x230) = state;
  }
  return;
}

Assistant:

void Viper::SetSuspensionVisualization(bool state) {
    for (auto& p : m_lower_arms)
        p->SetVisualize(state);
    for (auto& p : m_upper_arms)
        p->SetVisualize(state);
    for (auto& p : m_uprights)
        p->SetVisualize(state);
}